

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Decl_Arg_List(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  eval_error *this_00;
  Depth_Counter dc;
  Depth_Counter local_70;
  string local_68;
  string local_48;
  File_Position local_28;
  
  Depth_Counter::Depth_Counter(&local_70,this);
  SkipWS(this,true);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = Arg(this,true);
  if (bVar3) {
    do {
      bVar4 = Eol(this);
    } while (bVar4);
    while (bVar4 = Char(this,','), bVar4) {
      do {
        bVar4 = Eol(this);
      } while (bVar4);
      bVar4 = Arg(this,true);
      if (!bVar4) {
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Unexpected value in parameter list","");
        local_28.line = (this->m_position).line;
        local_28.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (this_00,&local_48,&local_28,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
  ::
  build_match<chaiscript::eval::Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
            ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
              *)this,(long)puVar1 - (long)puVar2 >> 3,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  SkipWS(this,true);
  (local_70.parser)->m_current_parse_depth = (local_70.parser)->m_current_parse_depth - 1;
  return bVar3;
}

Assistant:

bool Decl_Arg_List() {
        Depth_Counter dc{this};
        SkipWS(true);
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Arg()) {
          retval = true;
          while (Eol()) {
          }

          while (Char(',')) {
            while (Eol()) {
            }
            if (!Arg()) {
              throw exception::eval_error("Unexpected value in parameter list", File_Position(m_position.line, m_position.col), *m_filename);
            }
          }
        }
        build_match<eval::Arg_List_AST_Node<Tracer>>(prev_stack_top);

        SkipWS(true);

        return retval;
      }